

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

optional<double> * __thiscall
tinyusdz::primvar::PrimVar::get_ts_time
          (optional<double> *__return_storage_ptr__,PrimVar *this,size_t idx)

{
  storage_t<double> sVar1;
  pointer pSVar2;
  ulong uVar3;
  
  pSVar2 = (this->_ts)._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((this->_ts)._samples.
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish == pSVar2) ||
     (uVar3 = ((long)(this->_ts)._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) *
              -0x3333333333333333, uVar3 < idx || uVar3 - idx == 0)) {
    __return_storage_ptr__->has_value_ = false;
    __return_storage_ptr__->contained = (storage_t<double>)0x0;
  }
  else {
    if ((this->_ts)._dirty == true) {
      tinyusdz::value::TimeSamples::update(&this->_ts);
    }
    sVar1 = *(storage_t<double> *)
             ((this->_ts)._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start + idx);
    __return_storage_ptr__->has_value_ = true;
    __return_storage_ptr__->contained = sVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<double> get_ts_time(size_t idx) const {

    if (!has_timesamples()) {
      return nonstd::nullopt;
    }

    if (idx >= _ts.size()) {
      return nonstd::nullopt;
    }

    return _ts.get_time(idx);
  }